

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall
mjs::identifier_expression::identifier_expression
          (identifier_expression *this,source_extend *extend,wstring *id)

{
  expression::syntax_node(&this->super_expression,extend);
  (this->super_expression).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__identifier_expression_001be320;
  std::__cxx11::wstring::wstring((wstring *)&this->id_,(wstring *)id);
  return;
}

Assistant:

explicit identifier_expression(const source_extend& extend, const std::wstring& id) : expression(extend), id_(id) {}